

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::_Test_TruncatedTrailingRecordIsIgnored::_Run
          (_Test_TruncatedTrailingRecordIsIgnored *this)

{
  undefined1 local_578 [448];
  size_t local_3b8;
  int local_3ac;
  Tester local_3a8;
  undefined1 local_208 [471];
  allocator local_31;
  string local_30 [32];
  _Test_TruncatedTrailingRecordIsIgnored *local_10;
  _Test_TruncatedTrailingRecordIsIgnored *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"foo",&local_31);
  LogTest::Write(&this->super_LogTest,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogTest::ShrinkSize(&this->super_LogTest,4);
  test::Tester::Tester
            ((Tester *)(local_208 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x183);
  LogTest::Read_abi_cxx11_((LogTest *)local_208);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_208 + 0x20),(char (*) [4])"EOF",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  test::Tester::~Tester((Tester *)(local_208 + 0x20));
  test::Tester::Tester
            (&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x185);
  local_3ac = 0;
  local_3b8 = LogTest::DroppedBytes(&this->super_LogTest);
  test::Tester::IsEq<int,unsigned_long>(&local_3a8,&local_3ac,&local_3b8);
  test::Tester::~Tester(&local_3a8);
  test::Tester::Tester
            ((Tester *)(local_578 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x186);
  LogTest::ReportMessage_abi_cxx11_((LogTest *)local_578);
  test::Tester::IsEq<char[1],std::__cxx11::string>
            ((Tester *)(local_578 + 0x20),(char (*) [1])0x11b022,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578);
  std::__cxx11::string::~string((string *)local_578);
  test::Tester::~Tester((Tester *)(local_578 + 0x20));
  return;
}

Assistant:

TEST(LogTest, TruncatedTrailingRecordIsIgnored) {
  Write("foo");
  ShrinkSize(4);  // Drop all payload as well as a header byte
  ASSERT_EQ("EOF", Read());
  // Truncated last record is ignored, not treated as an error.
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}